

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::CommonCore(CommonCore *this)

{
  BrokerBase *in_RDI;
  double in_stack_ffffffffffffffc8;
  __integral_type_conflict __i;
  size_type *this_00;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar1;
  undefined8 in_stack_ffffffffffffffd8;
  undefined1 uVar2;
  iterator *this_01;
  id local_18;
  id local_10 [2];
  
  uVar2 = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  Core::Core((Core *)in_RDI);
  BrokerBase::BrokerBase(in_RDI,(bool)uVar2);
  in_RDI->_vptr_BrokerBase = (_func_int **)&PTR__CommonCore_0092cfd0;
  *(undefined **)&in_RDI->global_id = &DAT_0092d360;
  std::atomic<double>::atomic
            ((atomic<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  __i = (__integral_type_conflict)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  in_RDI[1].higher_broker_id.gid = 0;
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)&in_RDI[1].higher_broker_id);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::
  map<helics::GlobalFederateId,_helics::route_id,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
  ::map((map<helics::GlobalFederateId,_helics::route_id,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
         *)0x45f76c);
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::SimpleQueue
            ((SimpleQueue<helics::ActionMessage,_std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                   *)0x45f78e);
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x45f79f);
  std::make_unique<helics::TimeoutMonitor>();
  *(undefined4 *)
   &in_RDI[1].actionQueue.pushElements.
    super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  std::atomic<short>::atomic
            ((atomic<short> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (__integral_type_conflict3)((uint)__i >> 0x10));
  *(undefined1 *)
   ((long)&in_RDI[1].actionQueue.pushElements.
           super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl
           .super__Vector_impl_data._M_finish + 6) = 0;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::shared_guarded<>((shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
                      *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
  DualStringMappedVector
            ((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
              *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),__i);
  gmlc::libguarded::ordered_guarded<helics::HandleManager,_std::shared_mutex>::ordered_guarded<>
            ((ordered_guarded<helics::HandleManager,_std::shared_mutex> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  HandleManager::HandleManager
            ((HandleManager *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  CLI::std::
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  ::vector((vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
            *)0x45f847);
  in_RDI[3].actionQueue.priorityQueue.c.
  super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  this_01 = &in_RDI[3].actionQueue.priorityQueue.c.
             super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Deque_impl_data._M_start;
  std::thread::id::id(local_10);
  std::atomic<std::thread::id>::atomic((atomic<std::thread::id> *)this_01,local_10[0]);
  std::atomic<helics::GlobalFederateId>::atomic
            ((atomic<helics::GlobalFederateId> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  std::
  map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  ::map((map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
         *)0x45f89d);
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),__i);
  gmlc::concurrency::
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  DelayedObjects((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  std::
  deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::deque((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
           *)0x45f8d5);
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::vector((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
            *)0x45f8e8);
  in_RDI[4].brokerKey._M_dataplus._M_p = (pointer)0x0;
  this_00 = &in_RDI[4].brokerKey._M_string_length;
  std::thread::id::id(&local_18);
  std::atomic<std::thread::id>::atomic((atomic<std::thread::id> *)this_00,local_18);
  std::atomic<helics::GlobalFederateId>::atomic
            ((atomic<helics::GlobalFederateId> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar1 = 0;
  std::atomic<unsigned_short>::atomic
            ((atomic<unsigned_short> *)(ulong)in_stack_ffffffffffffffd0,
             (__integral_type_conflict4)((ulong)this_00 >> 0x30));
  uVar2 = (undefined1)((ulong)this_00 >> 0x38);
  std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>::array
            ((array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL> *
             )in_RDI);
  gmlc::concurrency::TriggerVariable::TriggerVariable
            ((TriggerVariable *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),(bool)uVar2);
  std::atomic<bool>::atomic((atomic<bool> *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),(bool)uVar2);
  return;
}

Assistant:

CommonCore::CommonCore() noexcept: timeoutMon(std::make_unique<TimeoutMonitor>()) {}